

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stmt.cc
# Opt level: O0

void __thiscall kratos::StmtBlock::StmtBlock(StmtBlock *this,StatementBlockType type)

{
  StatementBlockType type_local;
  StmtBlock *this_local;
  
  Stmt::Stmt(&this->super_Stmt,Block);
  (this->super_Stmt).super_IRNode._vptr_IRNode = (_func_int **)&PTR_accept_00589a00;
  std::vector<std::shared_ptr<kratos::Stmt>,_std::allocator<std::shared_ptr<kratos::Stmt>_>_>::
  vector(&this->stmts_);
  this->block_type_ = type;
  return;
}

Assistant:

StmtBlock::StmtBlock(StatementBlockType type) : Stmt(StatementType::Block), block_type_(type) {}